

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall
Omega_h::Write<double>::Write(Write<double> *this,LO size_in,double value,string *name_in)

{
  Write<double> local_20;
  
  Write(this,size_in,name_in);
  Write(&local_20,this);
  fill<double>(&local_20,value);
  ~Write(&local_20);
  return;
}

Assistant:

Write<T>::Write(LO size_in, T value, std::string const& name_in)
    : Write<T>(size_in, name_in) {
  fill(*this, value);
}